

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
          (PipelineLayoutCreateInfo *this,deUint32 _descriptorSetCount,
          VkDescriptorSetLayout *_pSetLayouts,deUint32 _pushConstantRangeCount,
          VkPushConstantRange *_pPushConstantRanges)

{
  iterator __position;
  pointer pVVar1;
  deUint32 dVar2;
  ulong uVar3;
  allocator_type local_31;
  
  uVar3 = (ulong)_descriptorSetCount;
  (this->m_setLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_setLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_setLayouts).
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>>::
  vector<vk::VkPushConstantRange_const*,void>
            ((vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>> *)
             &this->m_pushConstantRanges,_pPushConstantRanges,
             _pPushConstantRanges + _pushConstantRangeCount,&local_31);
  if (_descriptorSetCount != 0) {
    do {
      __position._M_current =
           (this->m_setLayouts).
           super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_setLayouts).
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::Handle<(vk::HandleType)19>,std::allocator<vk::Handle<(vk::HandleType)19>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)19>const&>
                  ((vector<vk::Handle<(vk::HandleType)19>,std::allocator<vk::Handle<(vk::HandleType)19>>>
                    *)&this->m_setLayouts,__position,_pSetLayouts);
      }
      else {
        (__position._M_current)->m_internal = _pSetLayouts->m_internal;
        (this->m_setLayouts).
        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      _pSetLayouts = _pSetLayouts + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  (this->super_VkPipelineLayoutCreateInfo).sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  (this->super_VkPipelineLayoutCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineLayoutCreateInfo).flags = 0;
  pVVar1 = (pointer)(this->m_setLayouts).
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  dVar2 = (deUint32)
          ((ulong)((long)(this->m_setLayouts).
                         super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 3);
  (this->super_VkPipelineLayoutCreateInfo).setLayoutCount = dVar2;
  if (dVar2 == 0) {
    pVVar1 = (pointer)0x0;
  }
  (this->super_VkPipelineLayoutCreateInfo).pSetLayouts = (VkDescriptorSetLayout *)pVVar1;
  pVVar1 = (this->m_pushConstantRanges).
           super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->m_pushConstantRanges).
                super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (uVar3 == 0) {
    pVVar1 = (pointer)0x0;
  }
  (this->super_VkPipelineLayoutCreateInfo).pushConstantRangeCount = (int)(uVar3 >> 2) * -0x55555555;
  (this->super_VkPipelineLayoutCreateInfo).pPushConstantRanges = pVVar1;
  return;
}

Assistant:

PipelineLayoutCreateInfo::PipelineLayoutCreateInfo (deUint32							_descriptorSetCount,
													const vk::VkDescriptorSetLayout*	_pSetLayouts,
													deUint32							_pushConstantRangeCount,
													const vk::VkPushConstantRange*		_pPushConstantRanges)
	: m_pushConstantRanges(_pPushConstantRanges, _pPushConstantRanges + _pushConstantRangeCount)
{
	for (unsigned int i = 0; i < _descriptorSetCount; i++)
	{
		m_setLayouts.push_back(_pSetLayouts[i]);
	}

	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
	pNext = DE_NULL;
	flags					= 0;
	setLayoutCount			= static_cast<deUint32>(m_setLayouts.size());
	pSetLayouts				= setLayoutCount > 0 ? &m_setLayouts[0] : DE_NULL;
	pushConstantRangeCount	= static_cast<deUint32>(m_pushConstantRanges.size());

	if (m_pushConstantRanges.size()) {
		pPushConstantRanges = &m_pushConstantRanges[0];
	}
	else
	{
		pPushConstantRanges = DE_NULL;
	}
}